

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::base::SetLogger(LogSeverity severity,Logger *logger)

{
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  LogDestination *pLVar1;
  int iVar2;
  LogDestination *pLVar3;
  pointer __p;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar2 == 0) {
    this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
           (&LogDestination::log_destinations_ + severity);
    if ((this->_M_t).
        super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
        .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
        (LogDestination *)0x0) {
      pLVar3 = (LogDestination *)operator_new(0xd0);
      LogDestination::LogDestination(pLVar3,severity,(char *)0x0);
      local_30._M_t.
      super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
      .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
           (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
           (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
           )0x0;
      std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      reset(this,pLVar3);
      std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                   *)&local_30);
    }
    pLVar3 = (this->_M_t).
             super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
             .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
    pLVar1 = (LogDestination *)pLVar3->logger_;
    if (pLVar1 != (LogDestination *)logger) {
      if (pLVar1 != pLVar3 && pLVar1 != (LogDestination *)0x0) {
        (*(pLVar1->fileobject_).super_Logger._vptr_Logger[1])();
      }
      pLVar3->logger_ = logger;
    }
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void base::SetLogger(LogSeverity severity, base::Logger* logger) {
  std::lock_guard<std::mutex> l{log_mutex};
  LogDestination::log_destination(severity)->SetLoggerImpl(logger);
}